

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

bitwidth_t __thiscall slang::SVInt::countLeadingZs(SVInt *this)

{
  uint64_t *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar3 = 0;
  if ((this->super_SVIntStorage).unknownFlag == true) {
    uVar3 = (this->super_SVIntStorage).bitWidth;
    uVar8 = uVar3 & 0x3f;
    bVar5 = 0x40 - (char)uVar8;
    uVar7 = uVar3 + 0x3f >> 6;
    puVar1 = (this->super_SVIntStorage).field_0.pVal;
    if (uVar8 == 0) {
      bVar5 = 0;
      uVar8 = 0x40;
    }
    uVar4 = (puVar1[(ulong)uVar7 - 1] & puVar1[(ulong)(uVar7 * 2) - 1]) << (bVar5 & 0x3f) ^
            0xffffffffffffffff;
    if (uVar4 == 0) {
      uVar3 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar3 = (uint)lVar2 ^ 0x3f;
    }
    if (uVar8 == uVar3) {
      uVar6 = uVar7 * 2 - 2;
      uVar3 = uVar8;
      for (uVar7 = uVar7 - 2; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
        if ((puVar1[uVar7] & puVar1[uVar6]) != 0xffffffffffffffff) {
          uVar4 = puVar1[uVar7] & puVar1[uVar6] ^ 0xffffffffffffffff;
          if (uVar4 == 0) {
            uVar8 = 0x40;
          }
          else {
            lVar2 = 0x3f;
            if (uVar4 != 0) {
              for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
              }
            }
            uVar8 = (uint)lVar2 ^ 0x3f;
          }
          return uVar8 + uVar3;
        }
        uVar3 = uVar3 + 0x40;
        uVar6 = uVar6 - 1;
      }
    }
  }
  return uVar3;
}

Assistant:

bitwidth_t SVInt::countLeadingZs() const {
    if (!hasUnknown())
        return 0;

    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int words = (int)getNumWords(bitWidth, false);
    int i = words - 1;
    bitwidth_t count = (bitwidth_t)std::countl_one((pVal[i + words] & pVal[i]) << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            auto elem = pVal[i + words] & pVal[i];
            if (elem == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(elem);
                break;
            }
        }
    }

    return count;
}